

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int cvRcheck2(CVodeMem cv_mem)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  double t;
  
  if (cv_mem->cv_irfnd != 0) {
    CVodeGetDky(cv_mem,cv_mem->cv_tlo,0,cv_mem->cv_y);
    iVar5 = (*cv_mem->cv_gfun)(cv_mem->cv_tlo,cv_mem->cv_y,cv_mem->cv_glo,cv_mem->cv_user_data);
    cv_mem->cv_nge = cv_mem->cv_nge + 1;
    if (iVar5 != 0) {
      return -0xc;
    }
    if (cv_mem->cv_nrtfn < 1) {
      return 0;
    }
    piVar3 = cv_mem->cv_iroots;
    lVar6 = 0;
    do {
      piVar3[lVar6] = 0;
      lVar6 = lVar6 + 1;
      lVar8 = (long)cv_mem->cv_nrtfn;
    } while (lVar6 < lVar8);
    if (0 < cv_mem->cv_nrtfn) {
      piVar3 = cv_mem->cv_gactive;
      bVar7 = true;
      lVar6 = 0;
      do {
        while (((piVar3[lVar6] == 0 || (cv_mem->cv_glo[lVar6] != 0.0)) ||
               (NAN(cv_mem->cv_glo[lVar6])))) {
          lVar6 = lVar6 + 1;
          if ((int)lVar8 <= lVar6) {
            if (bVar7) {
              return 0;
            }
            goto LAB_0011d1bb;
          }
        }
        cv_mem->cv_iroots[lVar6] = 1;
        lVar8 = (long)cv_mem->cv_nrtfn;
        lVar6 = lVar6 + 1;
        bVar7 = false;
      } while (lVar6 < lVar8);
LAB_0011d1bb:
      dVar1 = cv_mem->cv_h;
      dVar9 = (ABS(dVar1) + ABS(cv_mem->cv_tn)) * cv_mem->cv_uround * 100.0;
      cv_mem->cv_ttol = dVar9;
      dVar9 = (double)(~-(ulong)(0.0 < dVar1) & (ulong)-dVar9 | (ulong)dVar9 & -(ulong)(0.0 < dVar1)
                      );
      t = cv_mem->cv_tlo + dVar9;
      if (0.0 <= (t - cv_mem->cv_tn) * dVar1) {
        N_VLinearSum(0x3ff0000000000000,dVar9 / dVar1,cv_mem->cv_y,cv_mem->cv_zn[1],cv_mem->cv_y);
      }
      else {
        CVodeGetDky(cv_mem,t,0,cv_mem->cv_y);
      }
      iVar5 = (*cv_mem->cv_gfun)(t,cv_mem->cv_y,cv_mem->cv_ghi,cv_mem->cv_user_data);
      cv_mem->cv_nge = cv_mem->cv_nge + 1;
      if (iVar5 != 0) {
        return -0xc;
      }
      iVar5 = cv_mem->cv_nrtfn;
      if (0 < iVar5) {
        piVar3 = cv_mem->cv_gactive;
        lVar6 = 0;
        bVar4 = 0;
        do {
          if (piVar3[lVar6] != 0) {
            dVar1 = cv_mem->cv_ghi[lVar6];
            iVar2 = cv_mem->cv_iroots[lVar6];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              if (iVar2 == 1) {
                cv_mem->cv_glo[lVar6] = dVar1;
              }
            }
            else {
              if (iVar2 == 1) {
                return 3;
              }
              cv_mem->cv_iroots[lVar6] = 1;
              iVar5 = cv_mem->cv_nrtfn;
              bVar4 = 1;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
        return (uint)bVar4;
      }
    }
  }
  return 0;
}

Assistant:

static int cvRcheck2(CVodeMem cv_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  if (cv_mem->cv_irfnd == 0) { return (CV_SUCCESS); }

  (void)CVodeGetDky(cv_mem, cv_mem->cv_tlo, 0, cv_mem->cv_y);
  retval = cv_mem->cv_gfun(cv_mem->cv_tlo, cv_mem->cv_y, cv_mem->cv_glo,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++) { cv_mem->cv_iroots[i] = 0; }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_glo[i]) == ZERO)
    {
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
  }
  if (!zroot) { return (CV_SUCCESS); }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  smallh = (cv_mem->cv_h > ZERO) ? cv_mem->cv_ttol : -cv_mem->cv_ttol;
  tplus  = cv_mem->cv_tlo + smallh;
  if ((tplus - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
  {
    hratio = smallh / cv_mem->cv_h;
    N_VLinearSum(ONE, cv_mem->cv_y, hratio, cv_mem->cv_zn[1], cv_mem->cv_y);
  }
  else { (void)CVodeGetDky(cv_mem, tplus, 0, cv_mem->cv_y); }
  retval = cv_mem->cv_gfun(tplus, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_ghi[i]) == ZERO)
    {
      if (cv_mem->cv_iroots[i] == 1) { return (CLOSERT); }
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
    else
    {
      if (cv_mem->cv_iroots[i] == 1) { cv_mem->cv_glo[i] = cv_mem->cv_ghi[i]; }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (CV_SUCCESS);
}